

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallScriptGenerator::AddScriptInstallRule
          (cmInstallScriptGenerator *this,ostream *os,Indent indent,string *script)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  bVar1 = this->Code;
  poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  if (bVar1 == false) {
    poVar2 = std::operator<<(poVar2,"include(\"");
    pcVar3 = "\")\n";
  }
  else {
    pcVar3 = "\n";
  }
  poVar2 = std::operator<<(poVar2,(string *)script);
  std::operator<<(poVar2,pcVar3);
  return;
}

Assistant:

void cmInstallScriptGenerator::AddScriptInstallRule(std::ostream& os,
                                                    Indent indent,
                                                    std::string const& script)
{
  if (this->Code) {
    os << indent << script << "\n";
  } else {
    os << indent << "include(\"" << script << "\")\n";
  }
}